

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ordered_set.h
# Opt level: O1

void __thiscall xla::OrderedSet<int>::Erase(OrderedSet<int> *this,int value)

{
  mapped_type mVar1;
  int iVar2;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  pointer piVar5;
  pointer piVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  ulong uVar9;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  _Node_iterator_base<std::pair<const_int,_int>,_false> __it;
  
  uVar3 = (this->value_to_index_)._M_h._M_bucket_count;
  uVar9 = (ulong)(long)value % uVar3;
  p_Var10 = (this->value_to_index_)._M_h._M_buckets[uVar9];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var10 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var10->_M_nxt, p_Var11 = p_Var10, *(int *)&p_Var10->_M_nxt[1]._M_nxt != value)) {
    while (p_Var10 = p_Var4, p_Var4 = p_Var10->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var4[1]._M_nxt % uVar3 != uVar9) ||
         (p_Var11 = p_Var10, *(int *)&p_Var4[1]._M_nxt == value)) goto LAB_001b1d71;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_001b1d71:
  if (p_Var11 == (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)p_Var11->_M_nxt;
  }
  if (__it._M_cur == (__node_type *)0x0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Value not found in OrderedSet");
    std::endl<char,std::char_traits<char>>(poVar8);
    exit(0);
  }
  mVar1 = *(mapped_type *)((long)__it._M_cur + 0xc);
  pmVar7 = std::__detail::
           _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->value_to_index_,
                        (this->value_sequence_).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish + -1);
  *pmVar7 = mVar1;
  piVar5 = (this->value_sequence_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this->value_sequence_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar2 = piVar5[*(int *)((long)__it._M_cur + 0xc)];
  piVar5[*(int *)((long)__it._M_cur + 0xc)] = piVar6[-1];
  piVar6[-1] = iVar2;
  (this->value_sequence_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piVar6 + -1;
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase(&(this->value_to_index_)._M_h,(const_iterator)__it._M_cur);
  return;
}

Assistant:

void Erase(T value) {
    auto it = value_to_index_.find(value);
    if (it == value_to_index_.end()) {
      std::cerr << "Value not found in OrderedSet" << std::endl;
      exit(0);
    }

    auto index = it->second;
    // Since we don't want to move values around in `value_sequence_` we swap
    // the value in the last position and with value to be deleted and then
    // pop_back.
    value_to_index_[value_sequence_.back()] = index;
    std::swap(value_sequence_[it->second], value_sequence_.back());
    value_sequence_.pop_back();
    value_to_index_.erase(it);
  }